

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O3

void __thiscall
HighsCliqueTable::resolveSubstitution
          (HighsCliqueTable *this,HighsInt *col,double *val,double *offset)

{
  CliqueVar CVar1;
  pointer piVar2;
  pointer pSVar3;
  int iVar4;
  uint uVar5;
  
  piVar2 = (this->colsubstituted).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar4 = piVar2[*col];
  if (iVar4 != 0) {
    pSVar3 = (this->substitutions).
             super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      CVar1 = pSVar3[(long)iVar4 + -1].replace;
      if (-1 < (int)CVar1) {
        *offset = *val + *offset;
        *val = -*val;
      }
      uVar5 = (uint)CVar1 & 0x7fffffff;
      *col = uVar5;
      iVar4 = piVar2[uVar5];
    } while (iVar4 != 0);
  }
  return;
}

Assistant:

void HighsCliqueTable::resolveSubstitution(HighsInt& col, double& val,
                                           double& offset) const {
  while (colsubstituted[col]) {
    Substitution subst = substitutions[colsubstituted[col] - 1];
    if (subst.replace.val == 0) {
      offset += val;
      val = -val;
    }
    col = subst.replace.col;
  }
}